

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O0

void dump_fx(frameex1 *fx_addr68k)

{
  LispPTR LVar1;
  DLword *NAddr;
  DLword *pDStack_20;
  LispPTR atomindex;
  DLword *ptr;
  DLword *next68k;
  frameex1 *fx_addr68k_local;
  
  if (*(ushort *)&fx_addr68k->field_0x2 >> 0xd == 6) {
    LVar1 = get_framename(fx_addr68k);
    printf("\n*** Frame Extension for ");
    print(LVar1);
    LVar1 = LAddrFromNative(fx_addr68k);
    printf("\n %x : %x %x ",(ulong)LVar1,(ulong)*(ushort *)((ulong)fx_addr68k ^ 2),
           (ulong)*(ushort *)((ulong)&fx_addr68k->field_0x2 ^ 2));
    putchar(0x5b);
    if ((*(ushort *)&fx_addr68k->field_0x2 >> 0xc & 1) != 0) {
      printf("F,");
    }
    if ((*(ushort *)&fx_addr68k->field_0x2 >> 10 & 1) != 0) {
      printf("incall, ");
    }
    if ((*(ushort *)&fx_addr68k->field_0x2 >> 9 & 1) != 0) {
      printf("V, ");
    }
    printf("usecnt = %d]; alink",(ulong)(*(ushort *)&fx_addr68k->field_0x2 & 0xff));
    if ((fx_addr68k->alink & 1) != 0) {
      printf("[SLOWP]");
    }
    LVar1 = LAddrFromNative(&fx_addr68k->fnheader);
    printf("\n %x : %x %x fnheadlo, fnheadhi\n",(ulong)LVar1,
           (ulong)*(ushort *)((ulong)&fx_addr68k->fnheader ^ 2),
           (ulong)*(ushort *)((ulong)((long)&fx_addr68k->fnheader + 2U) ^ 2));
    LVar1 = LAddrFromNative(&fx_addr68k->pc);
    printf("\n %x : %x %x next,     pc\n",(ulong)LVar1,
           (ulong)*(ushort *)((ulong)&fx_addr68k->pc ^ 2),
           (ulong)*(ushort *)((ulong)&fx_addr68k->nextblock ^ 2));
    LVar1 = LAddrFromNative(&fx_addr68k->nametable);
    printf("\n %x : %x %x LoNmTbl,  HiNmTbl\n",(ulong)LVar1,
           (ulong)*(ushort *)((ulong)&fx_addr68k->nametable ^ 2),
           (ulong)*(ushort *)((ulong)((long)&fx_addr68k->nametable + 2U) ^ 2));
    pDStack_20 = &fx_addr68k->clink;
    LVar1 = LAddrFromNative(pDStack_20);
    printf("\n %x : %x %x #blink,   #clink\n",(ulong)LVar1,(ulong)*(ushort *)((ulong)pDStack_20 ^ 2)
           ,(ulong)*(ushort *)((ulong)&fx_addr68k->blink ^ 2));
    ptr = NativeAligned2FromStackOffset(fx_addr68k->nextblock);
    if (fx_addr68k == (frameex1 *)(MachineState.pvar + -10)) {
      ptr = MachineState.csp + 2;
    }
    if ((ptr < pDStack_20) || (((ulong)ptr & 1) != 0)) {
      printf("\nNext block invalid");
    }
    else {
      while (pDStack_20 < ptr) {
        NAddr = pDStack_20 + 2;
        LVar1 = LAddrFromNative(NAddr);
        printf("\n %x : %x %x",(ulong)LVar1,(ulong)*(ushort *)((ulong)NAddr ^ 2),
               (ulong)*(ushort *)((ulong)(pDStack_20 + 3) ^ 2));
        pDStack_20 = NAddr;
      }
    }
  }
  else {
    printf("\nInvalid frame,NOT FX");
  }
  return;
}

Assistant:

void dump_fx(struct frameex1 *fx_addr68k) {
  DLword *next68k;
  DLword *ptr;
  LispPTR atomindex;

  ptr = (DLword *)fx_addr68k;

  if (fx_addr68k->flags != 6) {
    printf("\nInvalid frame,NOT FX");
    return;
  }

  atomindex = get_framename((struct frameex1 *)fx_addr68k);
  printf("\n*** Frame Extension for ");
  print(atomindex);
  printf("\n %x : %x %x ", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));

  putchar('[');
  if (fx_addr68k->fast) printf("F,");
  if (fx_addr68k->incall) printf("incall, ");
  if (fx_addr68k->validnametable) printf("V, ");
  printf("usecnt = %d]; alink", fx_addr68k->usecount);
  if (fx_addr68k->alink & 1) printf("[SLOWP]");

  ptr += 2;
  printf("\n %x : %x %x fnheadlo, fnheadhi\n", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));

  ptr += 2;
  printf("\n %x : %x %x next,     pc\n", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));

  ptr += 2;
  printf("\n %x : %x %x LoNmTbl,  HiNmTbl\n", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));

  ptr += 2;
  printf("\n %x : %x %x #blink,   #clink\n", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));

  /* should pay attention to the name table like RAID does */

  next68k = NativeAligned2FromStackOffset(fx_addr68k->nextblock);
  if (fx_addr68k == CURRENTFX) { next68k = CurrentStackPTR + 2; }

  if ((next68k < ptr) || (((UNSIGNED)next68k & 1) != 0)) {
    printf("\nNext block invalid");
    return;
  }

  while (next68k > ptr) {
    ptr += 2;
    printf("\n %x : %x %x", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));
  }
}